

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.h
# Opt level: O1

void __thiscall FlasherInfo::~FlasherInfo(FlasherInfo *this)

{
  ~FlasherInfo(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

virtual ~FlasherInfo() {}